

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_gmatch_aux(lua_State *L)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  char *e;
  ulong uVar4;
  ulong uVar5;
  char *s;
  MatchState ms;
  int local_258;
  MatchState local_250;
  
  uVar5 = L->base[-2].u64 & 0x7fffffffffff;
  uVar2 = *(ulong *)(uVar5 + 0x38);
  uVar4 = *(ulong *)(uVar5 + 0x30) & 0x7fffffffffff;
  pcVar1 = (char *)(uVar4 + 0x18);
  local_250.src_end = (char *)(uVar4 + *(uint *)(uVar4 + 0x14) + 0x18);
  if (*(uint *)(uVar5 + 0x40) <= *(uint *)(uVar4 + 0x14)) {
    s = pcVar1 + *(uint *)(uVar5 + 0x40);
    local_250.src_init = pcVar1;
    local_250.L = L;
    do {
      local_250.level = 0;
      local_250.depth = 0;
      e = match(&local_250,s,(char *)((uVar2 & 0x7fffffffffff) + 0x18));
      if (e != (char *)0x0) {
        local_258 = (int)pcVar1;
        *(uint *)(uVar5 + 0x40) = (uint)(s == e) + ((int)e - local_258);
        iVar3 = push_captures(&local_250,s,e);
        return iVar3;
      }
      s = s + 1;
    } while (s <= local_250.src_end);
  }
  return 0;
}

Assistant:

LJLIB_NOREG LJLIB_CF(string_gmatch_aux)
{
  const char *p = strVdata(lj_lib_upvalue(L, 2));
  GCstr *str = strV(lj_lib_upvalue(L, 1));
  const char *s = strdata(str);
  TValue *tvpos = lj_lib_upvalue(L, 3);
  const char *src = s + tvpos->u32.lo;
  MatchState ms;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s + str->len;
  for (; src <= ms.src_end; src++) {
    const char *e;
    ms.level = ms.depth = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      int32_t pos = (int32_t)(e - s);
      if (e == src) pos++;  /* Ensure progress for empty match. */
      tvpos->u32.lo = (uint32_t)pos;
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}